

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

bool __thiscall deqp::egl::GLES2ThreadTest::FenceSync::waitReady(FenceSync *this,EGLThread *thread)

{
  int *piVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  undefined1 local_1b8 [136];
  ios_base local_130 [264];
  
  local_1b8._0_8_ = thread;
  if (this->m_serverSync == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar2 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Begin -- eglWaitSyncKHR(",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", 0)",4);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    iVar3 = (*thread->egl->_vptr_Library[0x3a])(thread->egl,this->m_display,this->m_sync,0);
    local_1b8._0_8_ = thread;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar2 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"End -- ",7);
    std::ostream::operator<<(poVar2,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = eglWaitSyncKHR()",0x13);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    bVar4 = iVar3 == 1;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar2 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Begin -- eglClientWaitSyncKHR(",0x1e)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,", EGL_SYNC_FLUSH_COMMANDS_BIT_KHR, 1000 000 000)",0x30);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    iVar3 = (*thread->egl->_vptr_Library[4])(thread->egl,this->m_display,this->m_sync,1,1000000000);
    local_1b8._0_8_ = thread;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar2 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"End -- ",7);
    std::ostream::operator<<(poVar2,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = eglClientWaitSyncKHR()",0x19);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    bVar4 = iVar3 == 0x30f6;
  }
  deMutex_lock((this->m_lock).m_mutex);
  piVar1 = &this->m_waiterCount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    local_1b8._0_8_ = thread;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar2 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Begin -- eglDestroySyncKHR(",0x1b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    iVar3 = (*thread->egl->_vptr_Library[0x18])(thread->egl,this->m_display,this->m_sync);
    local_1b8._0_8_ = thread;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar2 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"End -- ",7);
    std::ostream::operator<<(poVar2,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = eglDestroySyncKHR()",0x16);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    this->m_sync = (EGLSyncKHR)0x0;
  }
  deMutex_unlock((this->m_lock).m_mutex);
  return bVar4;
}

Assistant:

bool FenceSync::waitReady (EGLThread& thread)
{
	bool ok = true;
	if (m_serverSync)
	{
		thread.newMessage() << "Begin -- eglWaitSyncKHR(" << ((size_t)m_display) << ", " << ((size_t)m_sync) << ", 0)" << tcu::ThreadUtil::Message::End;
		EGLint result = thread.egl.waitSyncKHR(m_display, m_sync, 0);
		thread.newMessage() << "End -- " << result << " = eglWaitSyncKHR()" << tcu::ThreadUtil::Message::End;
		ok = result == EGL_TRUE;
	}
	else
	{
		thread.newMessage() << "Begin -- eglClientWaitSyncKHR(" << ((size_t)m_display) << ", " << ((size_t)m_sync) << ", EGL_SYNC_FLUSH_COMMANDS_BIT_KHR, 1000 000 000)" << tcu::ThreadUtil::Message::End;
		EGLint result = thread.egl.clientWaitSyncKHR(m_display, m_sync, EGL_SYNC_FLUSH_COMMANDS_BIT_KHR, 1000000000);
		thread.newMessage() << "End -- " << result << " = eglClientWaitSyncKHR()" << tcu::ThreadUtil::Message::End;
		ok = result == EGL_CONDITION_SATISFIED_KHR;
	}

	m_lock.lock();
	m_waiterCount--;
	DE_ASSERT(m_waiterCount >= 0);

	if (m_waiterCount == 0)
	{
		// \note [mika] This is no longer deterministic and eglDestroySyncKHR might happen in different places and in different threads
		thread.newMessage() << "Begin -- eglDestroySyncKHR(" << ((size_t)m_display) << ", " << ((size_t)m_sync) << ")" << tcu::ThreadUtil::Message::End;
		EGLint destroyResult = thread.egl.destroySyncKHR(m_display, m_sync);
		thread.newMessage() << "End -- " << destroyResult << " = eglDestroySyncKHR()" << tcu::ThreadUtil::Message::End;
		m_sync = DE_NULL;
	}

	m_lock.unlock();

	return ok;
}